

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int exp1(LexState *ls)

{
  int extraout_EAX;
  expdesc e;
  expdesc eStack_28;
  
  expr(ls,&eStack_28);
  luaK_exp2nextreg(ls->fs,&eStack_28);
  return extraout_EAX;
}

Assistant:

static int exp1 (LexState *ls) {
  expdesc e;
  int reg;
  expr(ls, &e);
  luaK_exp2nextreg(ls->fs, &e);
  lua_assert(e.k == VNONRELOC);
  reg = e.u.info;
  return reg;
}